

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O2

void __thiscall ON_MD5::Reset(ON_MD5 *this)

{
  this->m_byte_count = 0;
  this->m_bit_count[0] = 0;
  this->m_bit_count[1] = 0;
  this->m_state[0] = 0x67452301;
  this->m_state[1] = 0xefcdab89;
  this->m_state[2] = 0x98badcfe;
  this->m_state[3] = 0x10325476;
  this->m_status_bits = 1;
  return;
}

Assistant:

void ON_MD5::Reset()
{
  m_status_bits = 0;
  m_byte_count = 0;

  m_bit_count[0] = 0;
  m_bit_count[1] = 0;

  // MD5 initialization constants
  m_state[0] = 0x67452301;
  m_state[1] = 0xefcdab89;
  m_state[2] = 0x98badcfe;
  m_state[3] = 0x10325476;

  m_status_bits = 1;
}